

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     resize_if_allowed<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,double,double>
               (Matrix<double,_1,_3,_1,_1,_3> *dst,
               Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *src,
               assign_op<double,_double> *param_3)

{
  Index IVar1;
  Index cols;
  Index IVar2;
  bool bVar3;
  Index dstCols;
  Index dstRows;
  assign_op<double,_double> *param_2_local;
  Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *src_local;
  Matrix<double,_1,_3,_1,_1,_3> *dst_local;
  
  IVar1 = Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::rows(src);
  cols = Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::cols(src);
  IVar2 = PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::rows
                    (&dst->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>);
  if (IVar2 == IVar1) {
    IVar2 = PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::cols
                      (&dst->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>);
    if (IVar2 == cols) goto LAB_0019905d;
  }
  PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::resize
            (&dst->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,IVar1,cols);
LAB_0019905d:
  IVar2 = PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::rows
                    (&dst->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>);
  bVar3 = false;
  if (IVar2 == IVar1) {
    IVar1 = PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::cols
                      (&dst->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>);
    bVar3 = IVar1 == cols;
  }
  if (!bVar3) {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/AssignEvaluator.h"
                  ,0x2fd,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, 1, 3>, SrcXprType = Eigen::Transpose<Eigen::Matrix<double, 3, 1>>, T1 = double, T2 = double]"
                 );
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void resize_if_allowed(DstXprType &dst, const SrcXprType& src, const internal::assign_op<T1,T2> &/*func*/)
{
  Index dstRows = src.rows();
  Index dstCols = src.cols();
  if(((dst.rows()!=dstRows) || (dst.cols()!=dstCols)))
    dst.resize(dstRows, dstCols);
  eigen_assert(dst.rows() == dstRows && dst.cols() == dstCols);
}